

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ge(void)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  secp256k1_gej *r_00;
  void *__ptr;
  int odd;
  int ret_set_xo;
  int ret_frac_on_curve;
  int ret_on_curve;
  secp256k1_ge q;
  secp256k1_fe n_1;
  secp256k1_fe n;
  secp256k1_fe s;
  secp256k1_ge *ge_set_all;
  secp256k1_gej t;
  int swap;
  secp256k1_gej *gej_shuffled;
  secp256k1_gej sum;
  secp256k1_fe zr2;
  secp256k1_ge ge2_zfi;
  secp256k1_fe zrz_1;
  secp256k1_fe zrz;
  secp256k1_fe zr;
  secp256k1_ge ref;
  secp256k1_gej resj;
  secp256k1_gej refj;
  int i2;
  secp256k1_ge g;
  int j;
  secp256k1_fe zfi3;
  secp256k1_fe zfi2;
  secp256k1_fe r;
  secp256k1_fe zf;
  secp256k1_gej *gej;
  secp256k1_ge *ge;
  int runs;
  int i1;
  int i;
  secp256k1_gej *in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa40;
  uint32_t in_stack_fffffffffffffa44;
  bool local_5b5;
  int in_stack_fffffffffffffa58;
  int in_stack_fffffffffffffa5c;
  secp256k1_gej *in_stack_fffffffffffffa60;
  void *in_stack_fffffffffffffa70;
  secp256k1_gej *in_stack_fffffffffffffa78;
  secp256k1_ge *in_stack_fffffffffffffa80;
  secp256k1_gej *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  secp256k1_gej *in_stack_fffffffffffffaa8;
  secp256k1_gej *in_stack_fffffffffffffab0;
  secp256k1_gej *in_stack_fffffffffffffaf8;
  secp256k1_ge *in_stack_fffffffffffffb00;
  undefined1 local_488 [80];
  secp256k1_fe *in_stack_fffffffffffffbc8;
  secp256k1_ge *in_stack_fffffffffffffbd0;
  secp256k1_gej *in_stack_fffffffffffffbd8;
  secp256k1_gej *in_stack_fffffffffffffbe0;
  secp256k1_fe *in_stack_fffffffffffffbe8;
  secp256k1_gej *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffbfc;
  secp256k1_gej *in_stack_fffffffffffffc00;
  undefined1 local_3f8 [48];
  secp256k1_fe *in_stack_fffffffffffffc38;
  secp256k1_ge *in_stack_fffffffffffffc40;
  secp256k1_gej *in_stack_fffffffffffffc48;
  secp256k1_gej *in_stack_fffffffffffffc50;
  undefined1 local_350 [168];
  secp256k1_gej local_2a8 [3];
  int local_124;
  undefined1 local_120 [92];
  int local_c4;
  void *local_20;
  void *local_18;
  int local_c;
  int local_8;
  int local_4;
  
  local_c = 6;
  local_18 = checked_malloc((secp256k1_callback *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (size_t)in_stack_fffffffffffffa38);
  local_20 = checked_malloc((secp256k1_callback *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (size_t)in_stack_fffffffffffffa38);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x134a8c);
  secp256k1_ge_clear((secp256k1_ge *)0x134a99);
  secp256k1_ge_set_gej_var
            ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88);
  for (local_4 = 0; local_4 < local_c; local_4 = local_4 + 1) {
    random_group_element_test((secp256k1_ge *)in_stack_fffffffffffffa60);
    if (local_c + -2 <= local_4) {
      secp256k1_ge_mul_lambda
                ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (secp256k1_ge *)in_stack_fffffffffffffa38);
    }
    if (local_c + -1 <= local_4) {
      secp256k1_ge_mul_lambda
                ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (secp256k1_ge *)in_stack_fffffffffffffa38);
    }
    memcpy((void *)((long)local_18 + (long)(local_4 * 4 + 1) * 0x58),local_120,0x58);
    memcpy((void *)((long)local_18 + (long)(local_4 * 4 + 2) * 0x58),local_120,0x58);
    secp256k1_ge_neg((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                     (secp256k1_ge *)in_stack_fffffffffffffa38);
    secp256k1_ge_neg((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                     (secp256k1_ge *)in_stack_fffffffffffffa38);
    secp256k1_gej_set_ge
              ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (secp256k1_ge *)in_stack_fffffffffffffa38);
    random_group_element_jacobian_test
              ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
               (secp256k1_ge *)in_stack_fffffffffffffa88);
    secp256k1_gej_set_ge
              ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (secp256k1_ge *)in_stack_fffffffffffffa38);
    random_group_element_jacobian_test
              ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
               (secp256k1_ge *)in_stack_fffffffffffffa88);
    for (local_c4 = 0; local_c4 < 4; local_c4 = local_c4 + 1) {
      random_field_element_magnitude(&in_stack_fffffffffffffa60->x);
      random_field_element_magnitude(&in_stack_fffffffffffffa60->x);
      random_field_element_magnitude(&in_stack_fffffffffffffa60->x);
      random_field_element_magnitude(&in_stack_fffffffffffffa60->x);
      random_field_element_magnitude(&in_stack_fffffffffffffa60->x);
    }
  }
  random_fe_non_zero_test((secp256k1_fe *)0x134e23);
  random_field_element_magnitude(&in_stack_fffffffffffffa60->x);
  secp256k1_fe_impl_inv_var
            ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             &in_stack_fffffffffffffa88->x);
  secp256k1_fe_impl_sqr
            ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             &in_stack_fffffffffffffa38->x);
  secp256k1_fe_impl_mul
            ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x134e72);
  random_fe_non_zero_test((secp256k1_fe *)0x134e7f);
  local_8 = 0;
  do {
    if (local_c * 4 + 1 <= local_8) {
      memset(local_3f8,0,0x80);
      r_00 = (secp256k1_gej *)
             checked_malloc((secp256k1_callback *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (size_t)in_stack_fffffffffffffa38);
      for (local_4 = 0; local_4 < local_c * 4 + 1; local_4 = local_4 + 1) {
        memcpy(r_00 + local_4,(void *)((long)local_20 + (long)local_4 * 0x80),0x80);
      }
      for (local_4 = 0; iVar3 = local_4, local_4 < local_c * 4 + 1; local_4 = local_4 + 1) {
        uVar4 = secp256k1_testrand_int(in_stack_fffffffffffffa44);
        in_stack_fffffffffffffbfc = iVar3 + uVar4;
        if (in_stack_fffffffffffffbfc != local_4) {
          memcpy(local_488,r_00 + local_4,0x80);
          memcpy(r_00 + local_4,r_00 + in_stack_fffffffffffffbfc,0x80);
          memcpy(r_00 + in_stack_fffffffffffffbfc,local_488,0x80);
        }
      }
      for (local_4 = 0; local_4 < local_c * 4 + 1; local_4 = local_4 + 1) {
        secp256k1_gej_add_var
                  (r_00,(secp256k1_gej *)
                        CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                   in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      }
      iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x135a0d);
      if (iVar3 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0xf5f,"test condition failed: secp256k1_gej_is_infinity(&sum)");
        abort();
      }
      free(r_00);
      __ptr = checked_malloc((secp256k1_callback *)
                             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                             (size_t)in_stack_fffffffffffffa38);
      secp256k1_ge_set_all_gej_var
                (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (size_t)in_stack_fffffffffffffa70);
      for (local_4 = 0; local_4 < local_c * 4 + 1; local_4 = local_4 + 1) {
        random_fe_non_zero((secp256k1_fe *)
                           CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
        secp256k1_gej_rescale
                  (in_stack_fffffffffffffa60,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        ge_equals_gej(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      }
      free(__ptr);
      local_4 = 1;
      while( true ) {
        if (local_c * 4 + 1 <= local_4) {
          secp256k1_fe_impl_mul
                    ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                     &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x135cad);
          iVar3 = secp256k1_ge_x_on_curve_var(&in_stack_fffffffffffffa60->x);
          iVar5 = secp256k1_ge_x_frac_on_curve_var
                            ((secp256k1_fe *)
                             CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                             &in_stack_fffffffffffffa88->x);
          iVar6 = secp256k1_ge_set_xo_var
                            ((secp256k1_ge *)
                             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                             &in_stack_fffffffffffffa38->x,0);
          if (iVar3 != iVar5) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                    ,0xf82,"test condition failed: ret_on_curve == ret_frac_on_curve");
            abort();
          }
          if (iVar3 != iVar6) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                    ,0xf83,"test condition failed: ret_on_curve == ret_set_xo");
            abort();
          }
          if ((iVar6 != 0) &&
             (iVar3 = secp256k1_fe_equal_var
                                (&in_stack_fffffffffffffa60->x,
                                 (secp256k1_fe *)
                                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)),
             iVar3 == 0)) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                    ,0xf84,"test condition failed: secp256k1_fe_equal_var(&r, &q.x)");
            abort();
          }
          local_4 = 0;
          while( true ) {
            if (local_c * 4 + 1 <= local_4) {
              secp256k1_ge_set_all_gej_var
                        (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                         (size_t)in_stack_fffffffffffffa70);
              for (local_4 = 0; local_4 < local_c * 4 + 1; local_4 = local_4 + 1) {
                ge_equals_gej(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
              }
              for (local_4 = 0; local_4 < local_c * 4 + 1; local_4 = local_4 + 1) {
                secp256k1_gej_set_infinity((secp256k1_gej *)0x136007);
              }
              secp256k1_ge_set_all_gej_var
                        (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                         (size_t)in_stack_fffffffffffffa70);
              local_4 = 0;
              while( true ) {
                if (local_c * 4 + 1 <= local_4) {
                  free(local_18);
                  free(local_20);
                  return;
                }
                iVar3 = secp256k1_ge_is_infinity((secp256k1_ge *)0x136080);
                if (iVar3 == 0) break;
                local_4 = local_4 + 1;
              }
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                      ,0xfa2,"test condition failed: secp256k1_ge_is_infinity(&ge[i])");
              abort();
            }
            random_group_element_test((secp256k1_ge *)in_stack_fffffffffffffa60);
            uVar7 = secp256k1_fe_impl_is_odd
                              ((secp256k1_fe *)((long)local_18 + (long)local_4 * 0x58));
            local_5b5 = 1 < uVar7;
            if (local_5b5) break;
            if (uVar7 == local_4 % 2) {
              secp256k1_ge_set_infinity((secp256k1_ge *)0x135ef1);
            }
            secp256k1_gej_set_ge
                      ((secp256k1_gej *)CONCAT44(uVar7,in_stack_fffffffffffffa40),
                       (secp256k1_ge *)in_stack_fffffffffffffa38);
            local_4 = local_4 + 1;
          }
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0xf8c,"test condition failed: odd == 0 || odd == 1");
          abort();
        }
        iVar3 = secp256k1_ge_x_on_curve_var(&in_stack_fffffffffffffa60->x);
        if (iVar3 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0xf73,"test condition failed: secp256k1_ge_x_on_curve_var(&ge[i].x)");
          abort();
        }
        secp256k1_fe_impl_mul
                  ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                   &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x135c1a);
        iVar3 = secp256k1_ge_x_frac_on_curve_var
                          ((secp256k1_fe *)
                           CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                           &in_stack_fffffffffffffa88->x);
        if (iVar3 == 0) break;
        local_4 = local_4 + 1;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xf76,"test condition failed: secp256k1_ge_x_frac_on_curve_var(&n, &zf)");
      abort();
    }
    for (local_124 = 0; local_124 < local_c * 4 + 1; local_124 = local_124 + 1) {
      in_stack_fffffffffffffa80 = (secp256k1_ge *)((long)local_20 + (long)local_8 * 0x80);
      in_stack_fffffffffffffa88 = (secp256k1_gej *)((long)local_20 + (long)local_124 * 0x80);
      iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x134f21);
      if (iVar3 == 0) {
        in_stack_fffffffffffffa78 = local_2a8;
      }
      else {
        in_stack_fffffffffffffa78 = (secp256k1_gej *)0x0;
      }
      secp256k1_gej_add_var
                (in_stack_fffffffffffffc00,
                 (secp256k1_gej *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x134f76);
      if ((iVar3 == 0) && (iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x134f8c), iVar3 == 0)
         ) {
        secp256k1_fe_impl_mul
                  ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                   &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x134fc5);
        iVar3 = secp256k1_fe_equal_var
                          (&in_stack_fffffffffffffa60->x,
                           (secp256k1_fe *)
                           CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        if (iVar3 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0xf0b,"test condition failed: secp256k1_fe_equal_var(&zrz, &refj.z)");
          abort();
        }
      }
      secp256k1_ge_set_gej_var
                ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 in_stack_fffffffffffffa88);
      in_stack_fffffffffffffa70 = (void *)((long)local_18 + (long)local_124 * 0x58);
      iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x135092);
      if (iVar3 == 0) {
        in_stack_fffffffffffffa60 = local_2a8;
      }
      else {
        in_stack_fffffffffffffa60 = (secp256k1_gej *)0x0;
      }
      secp256k1_gej_add_ge_var
                (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                 in_stack_fffffffffffffbc8);
      ge_equals_gej(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x1350fc);
      if ((iVar3 == 0) && (iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x135112), iVar3 == 0)
         ) {
        secp256k1_fe_impl_mul
                  ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                   &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x13514b);
        iVar3 = secp256k1_fe_equal_var
                          (&in_stack_fffffffffffffa60->x,
                           (secp256k1_fe *)
                           CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        if (iVar3 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0xf14,"test condition failed: secp256k1_fe_equal_var(&zrz, &resj.z)");
          abort();
        }
      }
      memcpy(local_350,(void *)((long)local_18 + (long)local_124 * 0x58),0x58);
      secp256k1_fe_impl_mul
                ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x1351f5);
      secp256k1_fe_impl_mul
                ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x13521a);
      random_field_element_magnitude(&in_stack_fffffffffffffa60->x);
      random_field_element_magnitude(&in_stack_fffffffffffffa60->x);
      secp256k1_gej_add_zinv_var
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                 in_stack_fffffffffffffc38);
      ge_equals_gej(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      if (local_124 != 0) {
        secp256k1_gej_add_ge
                  (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
        ge_equals_gej(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      }
      if (((local_8 == 0) && (local_124 == 0)) ||
         ((in_stack_fffffffffffffa5c = (local_8 + 3) / 4,
          in_stack_fffffffffffffa5c == (local_124 + 3) / 4 &&
          (uVar1 = (long)(local_8 + 3) % 4,
          in_stack_fffffffffffffa58 =
               (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2),
          uVar1 = (long)(local_124 + 3) % 4,
          in_stack_fffffffffffffa58 ==
          (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2))))) {
        secp256k1_gej_double_var
                  ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                   in_stack_fffffffffffffa38,(secp256k1_fe *)0x13539f);
        ge_equals_gej(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
        secp256k1_fe_impl_mul
                  ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                   &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x1353df);
        iVar3 = secp256k1_fe_equal_var
                          (&in_stack_fffffffffffffa60->x,
                           (secp256k1_fe *)
                           CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        if (iVar3 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0xf31,"test condition failed: secp256k1_fe_equal_var(&zr2, &resj.z)");
          abort();
        }
        secp256k1_gej_double_var
                  ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                   in_stack_fffffffffffffa38,(secp256k1_fe *)0x135469);
        ge_equals_gej(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
        secp256k1_gej_double(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
        ge_equals_gej(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      }
      if ((((local_8 == 0) && (local_124 == 0)) ||
          (((local_8 + 3) / 4 == (local_124 + 3) / 4 &&
           (uVar1 = (long)(local_8 + 3) % 4, uVar2 = (long)(local_124 + 3) % 4,
           (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2) !=
           (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 2))))) &&
         (iVar3 = secp256k1_ge_is_infinity((secp256k1_ge *)0x135556), iVar3 == 0)) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0xf3c,"test condition failed: secp256k1_ge_is_infinity(&ref)");
        abort();
      }
      if (local_8 == 0) {
        iVar3 = secp256k1_ge_is_infinity((secp256k1_ge *)0x1355cd);
        if (iVar3 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0xf41,"test condition failed: secp256k1_ge_is_infinity(&ge[i1])");
          abort();
        }
        iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x135634);
        if (iVar3 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0xf42,"test condition failed: secp256k1_gej_is_infinity(&gej[i1])");
          abort();
        }
        ge_equals_gej(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      }
      if (local_124 == 0) {
        iVar3 = secp256k1_ge_is_infinity((secp256k1_ge *)0x1356cd);
        if (iVar3 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0xf46,"test condition failed: secp256k1_ge_is_infinity(&ge[i2])");
          abort();
        }
        iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x135734);
        if (iVar3 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0xf47,"test condition failed: secp256k1_gej_is_infinity(&gej[i2])");
          abort();
        }
        ge_equals_gej(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      }
    }
    local_8 = local_8 + 1;
  } while( true );
}

Assistant:

static void test_ge(void) {
    int i, i1;
    int runs = 6;
    /* 25 points are used:
     * - infinity
     * - for each of four random points p1 p2 p3 p4, we add the point, its
     *   negation, and then those two again but with randomized Z coordinate.
     * - The same is then done for lambda*p1 and lambda^2*p1.
     */
    secp256k1_ge *ge = (secp256k1_ge *)checked_malloc(&CTX->error_callback, sizeof(secp256k1_ge) * (1 + 4 * runs));
    secp256k1_gej *gej = (secp256k1_gej *)checked_malloc(&CTX->error_callback, sizeof(secp256k1_gej) * (1 + 4 * runs));
    secp256k1_fe zf, r;
    secp256k1_fe zfi2, zfi3;

    secp256k1_gej_set_infinity(&gej[0]);
    secp256k1_ge_clear(&ge[0]);
    secp256k1_ge_set_gej_var(&ge[0], &gej[0]);
    for (i = 0; i < runs; i++) {
        int j;
        secp256k1_ge g;
        random_group_element_test(&g);
        if (i >= runs - 2) {
            secp256k1_ge_mul_lambda(&g, &ge[1]);
        }
        if (i >= runs - 1) {
            secp256k1_ge_mul_lambda(&g, &g);
        }
        ge[1 + 4 * i] = g;
        ge[2 + 4 * i] = g;
        secp256k1_ge_neg(&ge[3 + 4 * i], &g);
        secp256k1_ge_neg(&ge[4 + 4 * i], &g);
        secp256k1_gej_set_ge(&gej[1 + 4 * i], &ge[1 + 4 * i]);
        random_group_element_jacobian_test(&gej[2 + 4 * i], &ge[2 + 4 * i]);
        secp256k1_gej_set_ge(&gej[3 + 4 * i], &ge[3 + 4 * i]);
        random_group_element_jacobian_test(&gej[4 + 4 * i], &ge[4 + 4 * i]);
        for (j = 0; j < 4; j++) {
            random_field_element_magnitude(&ge[1 + j + 4 * i].x);
            random_field_element_magnitude(&ge[1 + j + 4 * i].y);
            random_field_element_magnitude(&gej[1 + j + 4 * i].x);
            random_field_element_magnitude(&gej[1 + j + 4 * i].y);
            random_field_element_magnitude(&gej[1 + j + 4 * i].z);
        }
    }

    /* Generate random zf, and zfi2 = 1/zf^2, zfi3 = 1/zf^3 */
    random_fe_non_zero_test(&zf);
    random_field_element_magnitude(&zf);
    secp256k1_fe_inv_var(&zfi3, &zf);
    secp256k1_fe_sqr(&zfi2, &zfi3);
    secp256k1_fe_mul(&zfi3, &zfi3, &zfi2);

    /* Generate random r */
    random_fe_non_zero_test(&r);

    for (i1 = 0; i1 < 1 + 4 * runs; i1++) {
        int i2;
        for (i2 = 0; i2 < 1 + 4 * runs; i2++) {
            /* Compute reference result using gej + gej (var). */
            secp256k1_gej refj, resj;
            secp256k1_ge ref;
            secp256k1_fe zr;
            secp256k1_gej_add_var(&refj, &gej[i1], &gej[i2], secp256k1_gej_is_infinity(&gej[i1]) ? NULL : &zr);
            /* Check Z ratio. */
            if (!secp256k1_gej_is_infinity(&gej[i1]) && !secp256k1_gej_is_infinity(&refj)) {
                secp256k1_fe zrz; secp256k1_fe_mul(&zrz, &zr, &gej[i1].z);
                CHECK(secp256k1_fe_equal_var(&zrz, &refj.z));
            }
            secp256k1_ge_set_gej_var(&ref, &refj);

            /* Test gej + ge with Z ratio result (var). */
            secp256k1_gej_add_ge_var(&resj, &gej[i1], &ge[i2], secp256k1_gej_is_infinity(&gej[i1]) ? NULL : &zr);
            ge_equals_gej(&ref, &resj);
            if (!secp256k1_gej_is_infinity(&gej[i1]) && !secp256k1_gej_is_infinity(&resj)) {
                secp256k1_fe zrz; secp256k1_fe_mul(&zrz, &zr, &gej[i1].z);
                CHECK(secp256k1_fe_equal_var(&zrz, &resj.z));
            }

            /* Test gej + ge (var, with additional Z factor). */
            {
                secp256k1_ge ge2_zfi = ge[i2]; /* the second term with x and y rescaled for z = 1/zf */
                secp256k1_fe_mul(&ge2_zfi.x, &ge2_zfi.x, &zfi2);
                secp256k1_fe_mul(&ge2_zfi.y, &ge2_zfi.y, &zfi3);
                random_field_element_magnitude(&ge2_zfi.x);
                random_field_element_magnitude(&ge2_zfi.y);
                secp256k1_gej_add_zinv_var(&resj, &gej[i1], &ge2_zfi, &zf);
                ge_equals_gej(&ref, &resj);
            }

            /* Test gej + ge (const). */
            if (i2 != 0) {
                /* secp256k1_gej_add_ge does not support its second argument being infinity. */
                secp256k1_gej_add_ge(&resj, &gej[i1], &ge[i2]);
                ge_equals_gej(&ref, &resj);
            }

            /* Test doubling (var). */
            if ((i1 == 0 && i2 == 0) || ((i1 + 3)/4 == (i2 + 3)/4 && ((i1 + 3)%4)/2 == ((i2 + 3)%4)/2)) {
                secp256k1_fe zr2;
                /* Normal doubling with Z ratio result. */
                secp256k1_gej_double_var(&resj, &gej[i1], &zr2);
                ge_equals_gej(&ref, &resj);
                /* Check Z ratio. */
                secp256k1_fe_mul(&zr2, &zr2, &gej[i1].z);
                CHECK(secp256k1_fe_equal_var(&zr2, &resj.z));
                /* Normal doubling. */
                secp256k1_gej_double_var(&resj, &gej[i2], NULL);
                ge_equals_gej(&ref, &resj);
                /* Constant-time doubling. */
                secp256k1_gej_double(&resj, &gej[i2]);
                ge_equals_gej(&ref, &resj);
            }

            /* Test adding opposites. */
            if ((i1 == 0 && i2 == 0) || ((i1 + 3)/4 == (i2 + 3)/4 && ((i1 + 3)%4)/2 != ((i2 + 3)%4)/2)) {
                CHECK(secp256k1_ge_is_infinity(&ref));
            }

            /* Test adding infinity. */
            if (i1 == 0) {
                CHECK(secp256k1_ge_is_infinity(&ge[i1]));
                CHECK(secp256k1_gej_is_infinity(&gej[i1]));
                ge_equals_gej(&ref, &gej[i2]);
            }
            if (i2 == 0) {
                CHECK(secp256k1_ge_is_infinity(&ge[i2]));
                CHECK(secp256k1_gej_is_infinity(&gej[i2]));
                ge_equals_gej(&ref, &gej[i1]);
            }
        }
    }

    /* Test adding all points together in random order equals infinity. */
    {
        secp256k1_gej sum = SECP256K1_GEJ_CONST_INFINITY;
        secp256k1_gej *gej_shuffled = (secp256k1_gej *)checked_malloc(&CTX->error_callback, (4 * runs + 1) * sizeof(secp256k1_gej));
        for (i = 0; i < 4 * runs + 1; i++) {
            gej_shuffled[i] = gej[i];
        }
        for (i = 0; i < 4 * runs + 1; i++) {
            int swap = i + secp256k1_testrand_int(4 * runs + 1 - i);
            if (swap != i) {
                secp256k1_gej t = gej_shuffled[i];
                gej_shuffled[i] = gej_shuffled[swap];
                gej_shuffled[swap] = t;
            }
        }
        for (i = 0; i < 4 * runs + 1; i++) {
            secp256k1_gej_add_var(&sum, &sum, &gej_shuffled[i], NULL);
        }
        CHECK(secp256k1_gej_is_infinity(&sum));
        free(gej_shuffled);
    }

    /* Test batch gej -> ge conversion without known z ratios. */
    {
        secp256k1_ge *ge_set_all = (secp256k1_ge *)checked_malloc(&CTX->error_callback, (4 * runs + 1) * sizeof(secp256k1_ge));
        secp256k1_ge_set_all_gej_var(ge_set_all, gej, 4 * runs + 1);
        for (i = 0; i < 4 * runs + 1; i++) {
            secp256k1_fe s;
            random_fe_non_zero(&s);
            secp256k1_gej_rescale(&gej[i], &s);
            ge_equals_gej(&ge_set_all[i], &gej[i]);
        }
        free(ge_set_all);
    }

    /* Test that all elements have X coordinates on the curve. */
    for (i = 1; i < 4 * runs + 1; i++) {
        secp256k1_fe n;
        CHECK(secp256k1_ge_x_on_curve_var(&ge[i].x));
        /* And the same holds after random rescaling. */
        secp256k1_fe_mul(&n, &zf, &ge[i].x);
        CHECK(secp256k1_ge_x_frac_on_curve_var(&n, &zf));
    }

    /* Test correspondence of secp256k1_ge_x{,_frac}_on_curve_var with ge_set_xo. */
    {
        secp256k1_fe n;
        secp256k1_ge q;
        int ret_on_curve, ret_frac_on_curve, ret_set_xo;
        secp256k1_fe_mul(&n, &zf, &r);
        ret_on_curve = secp256k1_ge_x_on_curve_var(&r);
        ret_frac_on_curve = secp256k1_ge_x_frac_on_curve_var(&n, &zf);
        ret_set_xo = secp256k1_ge_set_xo_var(&q, &r, 0);
        CHECK(ret_on_curve == ret_frac_on_curve);
        CHECK(ret_on_curve == ret_set_xo);
        if (ret_set_xo) CHECK(secp256k1_fe_equal_var(&r, &q.x));
    }

    /* Test batch gej -> ge conversion with many infinities. */
    for (i = 0; i < 4 * runs + 1; i++) {
        int odd;
        random_group_element_test(&ge[i]);
        odd = secp256k1_fe_is_odd(&ge[i].x);
        CHECK(odd == 0 || odd == 1);
        /* randomly set half the points to infinity */
        if (odd == i % 2) {
            secp256k1_ge_set_infinity(&ge[i]);
        }
        secp256k1_gej_set_ge(&gej[i], &ge[i]);
    }
    /* batch convert */
    secp256k1_ge_set_all_gej_var(ge, gej, 4 * runs + 1);
    /* check result */
    for (i = 0; i < 4 * runs + 1; i++) {
        ge_equals_gej(&ge[i], &gej[i]);
    }

    /* Test batch gej -> ge conversion with all infinities. */
    for (i = 0; i < 4 * runs + 1; i++) {
        secp256k1_gej_set_infinity(&gej[i]);
    }
    /* batch convert */
    secp256k1_ge_set_all_gej_var(ge, gej, 4 * runs + 1);
    /* check result */
    for (i = 0; i < 4 * runs + 1; i++) {
        CHECK(secp256k1_ge_is_infinity(&ge[i]));
    }

    free(ge);
    free(gej);
}